

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::anon_unknown_0::ThreadCleanUpTest::init(ThreadCleanUpTest *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar2;
  FilterList *this_00;
  EGLConfig pvVar3;
  EGLContext pvVar4;
  EGLSurface pvVar5;
  ThreadCleanUpTest *extraout_RAX;
  undefined8 local_68;
  EGLint attribs [5];
  undefined8 local_48;
  EGLint attribList [3];
  undefined1 local_30 [8];
  FilterList filters;
  Library *egl;
  ThreadCleanUpTest *this_local;
  
  filters.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar2 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this->m_display = pvVar2;
  eglu::FilterList::FilterList((FilterList *)local_30);
  this_00 = eglu::FilterList::operator<<((FilterList *)local_30,isES2Renderable);
  eglu::FilterList::operator<<(this_00,isPBuffer);
  pvVar3 = eglu::chooseSingleConfig
                     ((Library *)
                      filters.m_rules.
                      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,this->m_display,
                      (FilterList *)local_30);
  this->m_config = pvVar3;
  eglu::FilterList::~FilterList((FilterList *)local_30);
  if (this->m_contextType == CONTEXTTYPE_SINGLE) {
    local_48 = 0x200003098;
    attribList[0] = 0x3038;
    (**(code **)*filters.m_rules.
                 super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
              (filters.m_rules.
               super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,0x30a0);
    pvVar4 = (EGLContext)
             (**(code **)(*filters.m_rules.
                           super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x30))
                       (filters.m_rules.
                        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,this->m_display,
                        this->m_config,0,&local_48);
    this->m_context = pvVar4;
    dVar1 = (**(code **)(*filters.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xf8))();
    eglu::checkError(dVar1,"Failed to create context",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglThreadCleanUpTests.cpp"
                     ,0xd0);
  }
  if (this->m_surfaceType == SURFACETYPE_SINGLE) {
    local_68 = 0x2000003057;
    attribs[0] = 0x3056;
    attribs[1] = 0x20;
    attribs[2] = 0x3038;
    pvVar5 = (EGLSurface)
             (**(code **)(*filters.m_rules.
                           super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x50))
                       (filters.m_rules.
                        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,this->m_display,
                        this->m_config,&local_68);
    this->m_surface = pvVar5;
    dVar1 = (**(code **)(*filters.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xf8))();
    eglu::checkError(dVar1,"Failed to create surface",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglThreadCleanUpTests.cpp"
                     ,0xdd);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void init (void)
	{
		const Library&	egl	= m_eglTestCtx.getLibrary();

		m_display = eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

		{
			eglu::FilterList filters;
			filters << isES2Renderable << isPBuffer;
			m_config = eglu::chooseSingleConfig(egl, m_display, filters);
		}

		if (m_contextType == CONTEXTTYPE_SINGLE)
		{
			const EGLint	attribList[] =
			{
				EGL_CONTEXT_CLIENT_VERSION, 2,
				EGL_NONE
			};

			egl.bindAPI(EGL_OPENGL_ES_API);

			m_context = egl.createContext(m_display, m_config, EGL_NO_CONTEXT, attribList);
			EGLU_CHECK_MSG(egl, "Failed to create context");
		}

		if (m_surfaceType == SURFACETYPE_SINGLE)
		{
			const EGLint attribs[] =
			{
				EGL_WIDTH, 32,
				EGL_HEIGHT, 32,
				EGL_NONE
			};

			m_surface = egl.createPbufferSurface(m_display, m_config, attribs);
			EGLU_CHECK_MSG(egl, "Failed to create surface");
		}
	}